

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O3

ostream * IO::operator<<(ostream *output,Element *element)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(output,"(",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (output,(element->name_)._M_dataplus._M_p,(element->name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(element->atomicWeight_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return output;
}

Assistant:

ostream& operator<<(ostream& output, const Element& element)
    {
        output << "(" << element.name_ << ", " << element.atomicWeight_ << ")";
        return output;
    }